

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

bool __thiscall mocker::Token::partialCompare(Token *this,Token *rhs)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  type_info *ptVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  long *plVar7;
  bool *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  Token *rhs_local;
  Token *this_local;
  
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->valPtr);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&rhs->valPtr);
  if (bVar2 == bVar3) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->valPtr);
    if (bVar2) {
      ptVar5 = type(this);
      peVar6 = std::
               __shared_ptr_access<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&rhs->valPtr);
      iVar4 = (*peVar6->_vptr_ValBase[2])();
      bVar2 = std::type_info::operator!=(ptVar5,(type_info *)CONCAT44(extraout_var,iVar4));
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        ptVar5 = type(this);
        bVar2 = std::type_info::operator==(ptVar5,(type_info *)&long::typeinfo);
        if (bVar2) {
          plVar7 = val<long>(this);
          lVar1 = *plVar7;
          plVar7 = val<long>(rhs);
          this_local._7_1_ = lVar1 == *plVar7;
        }
        else {
          ptVar5 = type(this);
          bVar2 = std::type_info::operator==(ptVar5,(type_info *)&bool::typeinfo);
          if (bVar2) {
            pbVar8 = val<bool>(this);
            bVar2 = *pbVar8;
            pbVar8 = val<bool>(rhs);
            this_local._7_1_ = (bVar2 & 1U) == (*pbVar8 & 1U);
          }
          else {
            pbVar9 = val<std::__cxx11::string>(this);
            std::__cxx11::string::string((string *)(t2.field_2._M_local_buf + 8),(string *)pbVar9);
            pbVar9 = val<std::__cxx11::string>(rhs);
            std::__cxx11::string::string(local_60,(string *)pbVar9);
            pbVar9 = val<std::__cxx11::string>(this);
            __rhs = val<std::__cxx11::string>(rhs);
            this_local._7_1_ = std::operator==(pbVar9,__rhs);
            std::__cxx11::string::~string(local_60);
            std::__cxx11::string::~string((string *)(t2.field_2._M_local_buf + 8));
          }
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Token::partialCompare(const Token &rhs) const {
  if ((bool)valPtr ^ (bool)rhs.valPtr)
    return false;
  if (!valPtr)
    return true;

  if (type() != rhs.valPtr->type())
    return false;
  if (type() == typeid(Integer))
    return val<Integer>() == rhs.val<Integer>();
  if (type() == typeid(bool))
    return val<bool>() == rhs.val<bool>();
  auto t1 = val<std::string>();
  auto t2 = rhs.val<std::string>();
  return val<std::string>() == rhs.val<std::string>();
}